

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O3

void __thiscall
avro::parsing::ValidatingEncoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_>::
startItem(ValidatingEncoder<avro::parsing::SimpleParser<avro::parsing::DummyHandler>_> *this)

{
  _Elt_pointer pSVar1;
  undefined8 *puVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pSVar1 = (this->parser_).parsingStack.c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar1 == (this->parser_).parsingStack.c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar1 = (this->parser_).parsingStack.c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  if (pSVar1[-1].kind_ == sRepeater) {
    (*((this->base_).px)->_vptr_Encoder[0x13])();
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"startItem at not an item boundary","");
  std::runtime_error::runtime_error((runtime_error *)(puVar2 + 1),(string *)local_40);
  *puVar2 = 0x1cc910;
  puVar2[1] = 0x1cc940;
  __cxa_throw(puVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

size_t handle(const Symbol& s) {
        return 0;
    }